

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

IVec4 __thiscall tcu::getFormatMaxIntValue(tcu *this,TextureFormat *format)

{
  ChannelOrder CVar1;
  ChannelType CVar2;
  undefined4 uVar3;
  int i;
  long lVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  IVec4 IVar9;
  IVec4 IVar10;
  
  CVar1 = format->order;
  CVar2 = format->type;
  uVar3 = CONCAT31((int3)(CVar1 >> 8),
                   (CVar1 == BGRA || CVar1 == RGBA) && CVar2 == SIGNED_INT_1010102_REV);
  if ((CVar1 == BGRA || CVar1 == RGBA) && CVar2 == SIGNED_INT_1010102_REV) {
    uVar5 = 0x1ff;
    uVar6 = 0x1ff;
    uVar7 = 0x1ff;
    uVar8 = 1;
LAB_0032a5ac:
    *(undefined4 *)this = uVar5;
    *(undefined4 *)(this + 4) = uVar6;
    *(undefined4 *)(this + 8) = uVar7;
    *(undefined4 *)(this + 0xc) = uVar8;
    IVar9.m_data[2] = uVar3;
    IVar9.m_data._0_8_ = this;
    IVar9.m_data[3] = 0;
    return (IVec4)IVar9.m_data;
  }
  if (CVar2 == SIGNED_INT8) {
    lVar4 = 0;
    do {
      *(undefined4 *)(this + lVar4 * 4) = 0x7f;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
  }
  else if (CVar2 == SIGNED_INT16) {
    lVar4 = 0;
    do {
      *(undefined4 *)(this + lVar4 * 4) = 0x7fff;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
  }
  else {
    if (CVar2 != SIGNED_INT32) {
      uVar5 = 0;
      uVar6 = 0;
      uVar7 = 0;
      uVar8 = 0;
      goto LAB_0032a5ac;
    }
    lVar4 = 0;
    do {
      *(undefined4 *)(this + lVar4 * 4) = 0x7fffffff;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
  }
  IVar10.m_data[2] = uVar3;
  IVar10.m_data._0_8_ = this;
  IVar10.m_data[3] = 0;
  return (IVec4)IVar10.m_data;
}

Assistant:

IVec4 getFormatMaxIntValue (const TextureFormat& format)
{
	DE_ASSERT(getTextureChannelClass(format.type) == TEXTURECHANNELCLASS_SIGNED_INTEGER);

	if (format == TextureFormat(TextureFormat::RGBA, TextureFormat::SIGNED_INT_1010102_REV) ||
		format == TextureFormat(TextureFormat::BGRA, TextureFormat::SIGNED_INT_1010102_REV))
		return IVec4(511, 511, 511, 1);

	switch (format.type)
	{
		case TextureFormat::SIGNED_INT8:	return IVec4(std::numeric_limits<deInt8>::max());
		case TextureFormat::SIGNED_INT16:	return IVec4(std::numeric_limits<deInt16>::max());
		case TextureFormat::SIGNED_INT32:	return IVec4(std::numeric_limits<deInt32>::max());

		default:
			DE_FATAL("Invalid channel type");
			return IVec4(0);
	}
}